

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineQueryActive
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLuint pipeline;
  Pipeline *pPVar1;
  deUint32 dVar2;
  deUint32 program;
  GLenum GVar3;
  ProgramWrapper *pPVar4;
  GLint queryActive;
  ProgramParams pipePp;
  PtrData<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  in_stack_fffffffffffffe28;
  deUint32 local_1c4;
  ProgramParams local_1c0;
  MessageBuilder local_1b0;
  
  local_1c0 = genProgramParams(&this->m_rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_1b0,this,&local_1c0);
  local_1b0.m_log = (TestLog *)0x0;
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::operator=(pipeOut,in_stack_fffffffffffffe28);
  pPVar1 = (pipeOut->
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           ).m_data.ptr;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)&local_1b0);
  pPVar4 = (pPVar1->vtxProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  pipeline = *(GLuint *)
              ((long)(pPVar1->pipeline).
                     super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                     .m_data.ptr + 8);
  if (pPVar4 == (ProgramWrapper *)0x0) {
    pPVar4 = (pPVar1->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  program = (*pPVar4->_vptr_ProgramWrapper[2])();
  local_1c4 = 0;
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,pipeline,0x8259,(GLint *)&local_1c4);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5ca);
  dVar2 = local_1c4;
  (this->super_CallLogWrapper).m_enableLog = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Program pipeline query reported non-zero initial active program",
             (allocator<char> *)&stack0xfffffffffffffe37);
  tcu::ResultCollector::check(&this->m_status,dVar2 == 0,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  glu::ProgramPipeline::activeShaderProgram
            ((pPVar1->pipeline).
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr,program);
  local_1b0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"Set pipeline ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  std::operator<<((ostream *)this_01,"\'s active shader program to ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_01);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,pipeline,0x8259,(GLint *)&local_1c4);
  GVar3 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar3,"glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5d3);
  dVar2 = local_1c4;
  (this->super_CallLogWrapper).m_enableLog = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Program pipeline query reported incorrect active program",
             (allocator<char> *)&stack0xfffffffffffffe37);
  tcu::ResultCollector::check(&this->m_status,dVar2 == program,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  glu::ProgramPipeline::activeShaderProgram
            ((pPVar1->pipeline).
             super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
             m_data.ptr,0);
  return;
}

Assistant:

void SeparateShaderTest::testPipelineQueryActive (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	GLuint						newActive	= pipeline.getVertexProgram().getProgramName();
	GLint						queryActive	= 0;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)));
	m_status.check(queryActive == 0,
				   "Program pipeline query reported non-zero initial active program");

	pipeline.pipeline->activeShaderProgram(newActive);
	log() << TestLog::Message
		  << "Set pipeline " << pipeName << "'s active shader program to " << newActive
		  << TestLog::EndMessage;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_ACTIVE_PROGRAM, &queryActive)));
	m_status.check(GLuint(queryActive) == newActive,
				   "Program pipeline query reported incorrect active program");

	pipeline.pipeline->activeShaderProgram(0);
}